

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  __pid_t _Var6;
  int iVar7;
  long lVar8;
  ssize_t sVar9;
  int *piVar10;
  char *pcVar11;
  long lVar12;
  long lVar13;
  __time_t _Var14;
  long lVar15;
  long lVar16;
  timeval *ptVar17;
  uint uVar18;
  bool bVar19;
  double dVar20;
  kwsysProcessTimeNative current_native;
  long local_b8;
  double *local_b0;
  long local_98;
  long local_90;
  timeval local_60;
  timeval *local_50;
  int *local_48;
  timeval local_40;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  if (cp->State != 3) {
    return 0;
  }
  if (cp->Killed != 0) {
    return 0;
  }
  if (cp->TimeoutExpired != 0) {
    return 0;
  }
  if (userTimeout == (double *)0x0) {
    local_90 = 0;
    local_98 = 0;
  }
  else {
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    local_98 = local_60.tv_sec;
    local_90 = local_60.tv_usec;
  }
  dVar1 = cp->Timeout;
  if ((0.0 < dVar1) && ((cp->TimeoutTime).tv_sec < 0)) {
    lVar12 = (long)((dVar1 - (double)(long)dVar1) * 1000000.0);
    lVar15 = (cp->StartTime).tv_usec;
    lVar16 = lVar15 + lVar12;
    lVar15 = lVar15 + -1000000 + lVar12;
    if (lVar16 < 0xf4241) {
      lVar15 = lVar16;
    }
    (cp->TimeoutTime).tv_sec = (ulong)(1000000 < lVar16) + (long)dVar1 + (cp->StartTime).tv_sec;
    (cp->TimeoutTime).tv_usec = lVar15;
  }
  lVar16 = (cp->TimeoutTime).tv_sec;
  lVar15 = (cp->TimeoutTime).tv_usec;
  if (userTimeout == (double *)0x0) {
    local_b0 = (double *)0x0;
    bVar4 = false;
    lVar12 = lVar16;
    local_b8 = lVar15;
  }
  else {
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    lVar8 = (long)*userTimeout;
    lVar13 = (long)((*userTimeout - (double)lVar8) * 1000000.0);
    lVar12 = local_60.tv_usec + lVar13;
    local_b8 = local_60.tv_usec + -1000000 + lVar13;
    if (lVar12 < 0xf4241) {
      local_b8 = lVar12;
    }
    lVar12 = (ulong)(1000000 < lVar12) + lVar8 + local_60.tv_sec;
    if (-1 < lVar16) {
      if ((lVar16 <= lVar12) && (lVar12 != lVar16 || lVar15 <= local_b8)) {
        local_b0 = (double *)0x0;
        bVar4 = false;
        lVar12 = lVar16;
        local_b8 = lVar15;
        goto LAB_003e925b;
      }
    }
    bVar4 = true;
    local_b0 = userTimeout;
  }
LAB_003e925b:
  ptVar17 = (timeval *)0x0;
  __readfds = &cp->PipeSet;
  local_48 = &cp->SignalPipe;
  local_50 = &local_40;
  if (lVar12 < 0) {
    local_50 = ptVar17;
  }
  bVar3 = false;
  do {
    iVar7 = (int)ptVar17;
    if (cp->PipesLeft < 1) break;
    lVar16 = 0;
    do {
      uVar18 = cp->PipeReadEnds[lVar16];
      bVar5 = bVar3;
      if (-1 < (int)uVar18) {
        if (((ulong)__readfds->__fds_bits[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1) != 0) {
          __readfds->__fds_bits[uVar18 >> 6] =
               __readfds->__fds_bits[uVar18 >> 6] & ~(1L << ((byte)uVar18 & 0x3f));
          do {
            sVar9 = read(cp->PipeReadEnds[lVar16],cp->PipeBuffer,0x400);
            if (-1 < sVar9) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
          if (sVar9 < 1) {
            if ((-1 < sVar9) || (piVar10 = __errno_location(), *piVar10 != 0xb)) {
              kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar16);
              cp->PipesLeft = cp->PipesLeft + -1;
            }
          }
          else if (lVar16 == 2) {
            if (0 < cp->NumberOfCommands) {
              lVar15 = 0;
              do {
                if (cp->ForkPIDs[lVar15] != 0) {
                  do {
                    _Var6 = waitpid(cp->ForkPIDs[lVar15],cp->CommandExitCodes + lVar15,1);
                    if (-1 < _Var6) break;
                    piVar10 = __errno_location();
                  } while (*piVar10 == 4);
                  if (_Var6 < 1) {
                    if ((_Var6 < 0) && (cp->State != 1)) {
                      piVar10 = __errno_location();
                      pcVar11 = strerror(*piVar10);
                      strncpy(cp->ErrorMessage,pcVar11,0x400);
                      cp->State = 1;
                    }
                  }
                  else {
                    cp->ForkPIDs[lVar15] = 0;
                    piVar10 = &cp->CommandsLeft;
                    *piVar10 = *piVar10 + -1;
                    if (*piVar10 == 0) {
                      kwsysProcessCleanupDescriptor(local_48);
                    }
                  }
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < cp->NumberOfCommands);
            }
          }
          else if (length != (int *)0x0 && data != (char **)0x0) {
            *data = cp->PipeBuffer;
            *length = (int)sVar9;
            bVar19 = true;
            if ((int)lVar16 != 1) {
              if ((int)lVar16 == 0) {
                ptVar17 = (timeval *)0x2;
              }
              goto LAB_003e9464;
            }
            ptVar17 = (timeval *)0x3;
            goto LAB_003e9460;
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    if (iVar7 == 0) {
      (cp->PipeSet).__fds_bits[0xe] = 0;
      (cp->PipeSet).__fds_bits[0xf] = 0;
      (cp->PipeSet).__fds_bits[0xc] = 0;
      (cp->PipeSet).__fds_bits[0xd] = 0;
      (cp->PipeSet).__fds_bits[10] = 0;
      (cp->PipeSet).__fds_bits[0xb] = 0;
      (cp->PipeSet).__fds_bits[8] = 0;
      (cp->PipeSet).__fds_bits[9] = 0;
      (cp->PipeSet).__fds_bits[6] = 0;
      (cp->PipeSet).__fds_bits[7] = 0;
      (cp->PipeSet).__fds_bits[4] = 0;
      (cp->PipeSet).__fds_bits[5] = 0;
      (cp->PipeSet).__fds_bits[2] = 0;
      (cp->PipeSet).__fds_bits[3] = 0;
      __readfds->__fds_bits[0] = 0;
      (cp->PipeSet).__fds_bits[1] = 0;
      _Var14 = local_40.tv_sec;
      lVar16 = local_40.tv_usec;
      if (lVar12 < 0) {
LAB_003e951d:
        local_40.tv_usec = lVar16;
        local_40.tv_sec = _Var14;
        uVar18 = 0xffffffff;
        lVar16 = 3;
        do {
          uVar2 = cp->PipeReadEnds[lVar16 + -3];
          if ((-1 < (int)uVar2) &&
             (__readfds->__fds_bits[uVar2 >> 6] =
                   __readfds->__fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f),
             (int)uVar18 < (int)uVar2)) {
            uVar18 = uVar2;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 6);
        if ((int)uVar18 < 0) goto LAB_003e9460;
        do {
          iVar7 = select(uVar18 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,local_50);
          if (-1 < iVar7) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        bVar19 = iVar7 == 0;
        if (bVar19) {
          bVar5 = true;
        }
        if (iVar7 < 0) {
          piVar10 = __errno_location();
          pcVar11 = strerror(*piVar10);
          strncpy(cp->ErrorMessage,pcVar11,0x400);
          cmsysProcess_Kill(cp);
          cp->Killed = 0;
          cp->SelectError = 1;
          bVar19 = false;
          bVar5 = bVar3;
        }
      }
      else {
        gettimeofday(&local_60,(__timezone_ptr_t)0x0);
        lVar15 = local_b8 - local_60.tv_usec;
        _Var14 = (lVar15 >> 0x3f) + (lVar12 - local_60.tv_sec);
        lVar16 = lVar15 + 1000000;
        if (-1 < lVar15) {
          lVar16 = lVar15;
        }
        if (((local_b0 != (double *)0x0) && (_Var14 < 0)) && (*local_b0 <= 0.0)) {
          lVar16 = 0;
          _Var14 = 0;
        }
        if (-1 < _Var14) goto LAB_003e951d;
        bVar19 = true;
        bVar5 = true;
      }
    }
    else {
LAB_003e9460:
      bVar19 = true;
    }
LAB_003e9464:
    bVar3 = bVar5;
    iVar7 = (int)ptVar17;
  } while (!bVar19);
  if (userTimeout != (double *)0x0) {
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    local_90 = local_60.tv_usec - local_90;
    lVar16 = local_90 + 1000000;
    if (-1 < local_90) {
      lVar16 = local_90;
    }
    dVar1 = *userTimeout -
            ((double)lVar16 * 1e-06 + (double)((local_90 >> 0x3f) + (local_60.tv_sec - local_98)));
    dVar20 = 0.0;
    if (0.0 <= dVar1) {
      dVar20 = dVar1;
    }
    *userTimeout = dVar20;
  }
  if (iVar7 == 0) {
    iVar7 = 0xff;
    if (!bVar3) {
      iVar7 = 0;
    }
    if (!bVar4 && bVar3) {
      cmsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = {0, 0};
  kwsysProcessWaitData wd =
    {
      0,
      kwsysProcess_Pipe_None,
      0,
      0,
      {0, 0}
    };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
     cp->TimeoutExpired)
    {
    return kwsysProcess_Pipe_None;
    }

  /* Record the time at which user timeout period starts.  */
  if(userTimeout)
    {
    userStartTime = kwsysProcessTimeGetCurrent();
    }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout,
                                       &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while(cp->PipesLeft > 0 &&
        !kwsysProcessWaitForPipe(cp, data, length, &wd)) {}

  /* Update the user timeout.  */
  if(userTimeout)
    {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference = kwsysProcessTimeSubtract(userEndTime,
                                                           userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if(*userTimeout < 0)
      {
      *userTimeout = 0;
      }
    }

  /* Check what happened.  */
  if(wd.PipeId)
    {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
    }
  else if(wd.Expired)
    {
    /* A timeout has expired.  */
    if(wd.User)
      {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
      }
    else
      {
      /* The process timeout has expired.  Kill the children now.  */
      kwsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      return kwsysProcess_Pipe_None;
      }
    }
  else
    {
    /* No pipes are left open.  */
    return kwsysProcess_Pipe_None;
    }
}